

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Orphan<capnp::DynamicValue> * __thiscall
capnp::Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,Orphanage *this,Reader *copyFrom)

{
  undefined8 uVar1;
  Type TVar2;
  DynamicEnum value;
  Orphan<capnp::AnyPointer> local_1d8;
  Client local_1b8;
  Orphan<capnp::DynamicCapability> local_1a0;
  char *local_178;
  size_t sStack_170;
  SegmentReader *local_168;
  CapTableReader *pCStack_160;
  byte *local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  Orphan<capnp::DynamicStruct> local_140;
  char *local_118;
  size_t sStack_110;
  SegmentReader *local_108;
  CapTableReader *pCStack_100;
  byte *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Orphan<capnp::DynamicList> local_d8;
  char *local_a8;
  size_t sStack_a0;
  Orphan<capnp::Data> local_98;
  int64_t local_68;
  size_t sStack_60;
  Orphan<capnp::Text> local_58;
  int64_t local_38;
  undefined2 local_30;
  undefined6 uStack_2e;
  Reader *local_20;
  Reader *copyFrom_local;
  Orphanage *this_local;
  
  local_20 = copyFrom;
  copyFrom_local = (Reader *)this;
  this_local = (Orphanage *)__return_storage_ptr__;
  TVar2 = DynamicValue::Reader::getType(copyFrom);
  switch(TVar2) {
  case UNKNOWN:
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(void *)0x0);
    break;
  case VOID:
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__);
    break;
  case BOOL:
    Orphan<capnp::DynamicValue>::Orphan
              (__return_storage_ptr__,(bool)((copyFrom->field_1).field12[0] & 1));
    break;
  case INT:
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(copyFrom->field_1).intValue);
    break;
  case UINT:
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(copyFrom->field_1).uintValue);
    break;
  case FLOAT:
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(copyFrom->field_1).floatValue);
    break;
  case TEXT:
    local_68 = (copyFrom->field_1).intValue;
    sStack_60 = (copyFrom->field_1).textValue.super_StringPtr.content.size_;
    newOrphanCopy<capnp::Text::Reader>
              (&local_58,this,(Reader)(copyFrom->field_1).textValue.super_StringPtr.content);
    Orphan<capnp::DynamicValue>::Orphan<capnp::Text>(__return_storage_ptr__,&local_58);
    Orphan<capnp::Text>::~Orphan(&local_58);
    break;
  case DATA:
    local_a8 = (copyFrom->field_1).textValue.super_StringPtr.content.ptr;
    sStack_a0 = (copyFrom->field_1).textValue.super_StringPtr.content.size_;
    newOrphanCopy<capnp::Data::Reader>
              (&local_98,this,
               (Reader)(copyFrom->field_1).dataValue.super_ArrayPtr<const_unsigned_char>);
    Orphan<capnp::DynamicValue>::Orphan<capnp::Data>(__return_storage_ptr__,&local_98);
    Orphan<capnp::Data>::~Orphan(&local_98);
    break;
  case LIST:
    local_118 = (copyFrom->field_1).textValue.super_StringPtr.content.ptr;
    sStack_110 = (copyFrom->field_1).textValue.super_StringPtr.content.size_;
    local_108 = (copyFrom->field_1).listValue.reader.segment;
    pCStack_100 = (copyFrom->field_1).listValue.reader.capTable;
    local_f8 = (copyFrom->field_1).listValue.reader.ptr;
    uStack_f0._0_4_ = *(ListElementCount *)((long)&copyFrom->field_1 + 0x28);
    uStack_f0._4_4_ = *(BitsPerElementN<23> *)((long)&copyFrom->field_1 + 0x2c);
    local_e8._0_4_ = *(StructDataBitCount *)((long)&copyFrom->field_1 + 0x30);
    local_e8._4_2_ = *(StructPointerCount *)((long)&copyFrom->field_1 + 0x34);
    local_e8._6_1_ = *(ElementSize *)((long)&copyFrom->field_1 + 0x36);
    local_e8._7_1_ = *(undefined1 *)((long)&copyFrom->field_1 + 0x37);
    uStack_e0 = *(undefined8 *)&(copyFrom->field_1).listValue.reader.nestingLimit;
    newOrphanCopy<capnp::DynamicList::Reader>(&local_d8,this,(copyFrom->field_1).listValue);
    Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicList>(__return_storage_ptr__,&local_d8);
    Orphan<capnp::DynamicList>::~Orphan(&local_d8);
    break;
  case ENUM:
    local_38 = (copyFrom->field_1).intValue;
    uVar1 = *(undefined8 *)((long)&copyFrom->field_1 + 8);
    local_30 = (undefined2)uVar1;
    uStack_2e = (undefined6)((ulong)uVar1 >> 0x10);
    value._10_6_ = 0;
    value._0_10_ = *(unkuint10 *)&copyFrom->field_1;
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,value);
    break;
  case STRUCT:
    local_148._0_4_ = *(StructDataBitCount *)((long)&copyFrom->field_1 + 0x30);
    local_148._4_2_ = *(StructPointerCount *)((long)&copyFrom->field_1 + 0x34);
    local_148._6_1_ = *(ElementSize *)((long)&copyFrom->field_1 + 0x36);
    local_148._7_1_ = *(undefined1 *)((long)&copyFrom->field_1 + 0x37);
    local_178 = (copyFrom->field_1).textValue.super_StringPtr.content.ptr;
    sStack_170 = (copyFrom->field_1).textValue.super_StringPtr.content.size_;
    local_168 = (copyFrom->field_1).listValue.reader.segment;
    pCStack_160 = (copyFrom->field_1).listValue.reader.capTable;
    local_158 = (copyFrom->field_1).listValue.reader.ptr;
    uStack_150._0_4_ = *(ListElementCount *)((long)&copyFrom->field_1 + 0x28);
    uStack_150._4_4_ = *(BitsPerElementN<23> *)((long)&copyFrom->field_1 + 0x2c);
    newOrphanCopy<capnp::DynamicStruct::Reader>(&local_140,this,(copyFrom->field_1).structValue);
    Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>(__return_storage_ptr__,&local_140);
    Orphan<capnp::DynamicStruct>::~Orphan(&local_140);
    break;
  case CAPABILITY:
    DynamicCapability::Client::Client(&local_1b8,&(copyFrom->field_1).capabilityValue);
    newOrphanCopy<capnp::DynamicCapability::Client>(&local_1a0,this,&local_1b8);
    Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicCapability>(__return_storage_ptr__,&local_1a0)
    ;
    Orphan<capnp::DynamicCapability>::~Orphan(&local_1a0);
    DynamicCapability::Client::~Client(&local_1b8);
    break;
  case ANY_POINTER:
    newOrphanCopy<capnp::AnyPointer::Reader>
              (&local_1d8,this,(Reader)(copyFrom->field_1).anyPointerValue.reader);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,&local_1d8);
    Orphan<capnp::AnyPointer>::~Orphan(&local_1d8);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> Orphanage::newOrphanCopy<DynamicValue::Reader>(
    DynamicValue::Reader copyFrom) const {
  switch (copyFrom.getType()) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return copyFrom.voidValue;
    case DynamicValue::BOOL: return copyFrom.boolValue;
    case DynamicValue::INT: return copyFrom.intValue;
    case DynamicValue::UINT: return copyFrom.uintValue;
    case DynamicValue::FLOAT: return copyFrom.floatValue;
    case DynamicValue::ENUM: return copyFrom.enumValue;

    case DynamicValue::TEXT: return newOrphanCopy(copyFrom.textValue);
    case DynamicValue::DATA: return newOrphanCopy(copyFrom.dataValue);
    case DynamicValue::LIST: return newOrphanCopy(copyFrom.listValue);
    case DynamicValue::STRUCT: return newOrphanCopy(copyFrom.structValue);
    case DynamicValue::CAPABILITY: return newOrphanCopy(copyFrom.capabilityValue);
    case DynamicValue::ANY_POINTER: return newOrphanCopy(copyFrom.anyPointerValue);
  }
  KJ_UNREACHABLE;
}